

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifr.c
# Opt level: O0

int igsc_ifr_run_test(igsc_device_handle *handle,uint8_t test_type,uint8_t tiles_mask,
                     uint8_t *result,uint8_t *run_status,uint32_t *error_code)

{
  long lVar1;
  igsc_lib_ctx *lib_ctx_00;
  uint8_t *__s;
  ifr_msg_hdr *resp_header;
  size_t buf_size;
  uint uVar2;
  int iVar3;
  igsc_log_func_t p_Var4;
  char *pcVar5;
  long in_FS_OFFSET;
  undefined8 in_stack_fffffffffffff1e8;
  undefined4 uVar6;
  igsc_log_func_t igsc_log_func_14;
  igsc_log_func_t igsc_log_func_13;
  igsc_log_func_t igsc_log_func_12;
  igsc_log_func_t igsc_log_func_11;
  igsc_log_func_t igsc_log_func_10;
  igsc_log_func_t igsc_log_func_9;
  igsc_log_func_t igsc_log_func_8;
  igsc_log_func_t igsc_log_func_7;
  igsc_log_func_t igsc_log_func_6;
  igsc_log_func_t igsc_log_func_5;
  igsc_log_func_t igsc_log_func_4;
  igsc_log_func_t igsc_log_func_3;
  igsc_log_func_t igsc_log_func_2;
  igsc_log_func_t igsc_log_func_1;
  igsc_log_func_t igsc_log_func;
  ifr_run_test_res *resp;
  ifr_run_test_req *req;
  igsc_lib_ctx *lib_ctx;
  size_t buf_len;
  size_t response_len;
  size_t request_len;
  int status;
  uint32_t *error_code_local;
  uint8_t *run_status_local;
  uint8_t *result_local;
  uint8_t tiles_mask_local;
  uint8_t test_type_local;
  igsc_device_handle *handle_local;
  size_t local_ca0;
  size_t received_len;
  char __time_buf_24 [128];
  char __time_buf_23 [128];
  char __time_buf_22 [128];
  char __time_buf_21 [128];
  char __time_buf_20 [128];
  char __time_buf_19 [128];
  char __time_buf_18 [128];
  char __time_buf_17 [128];
  char __time_buf_16 [128];
  char __time_buf_15 [128];
  char __time_buf_14 [128];
  char __time_buf_13 [128];
  char __time_buf_12 [128];
  char __time_buf_11 [128];
  char __time_buf_10 [128];
  char __time_buf_9 [128];
  char __time_buf_8 [128];
  char __time_buf_7 [128];
  char __time_buf_6 [128];
  char __time_buf_5 [128];
  char __time_buf_4 [128];
  char __time_buf_3 [128];
  char __time_buf_2 [128];
  char __time_buf_1 [128];
  char __time_buf [128];
  
  uVar6 = (undefined4)((ulong)in_stack_fffffffffffff1e8 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_ca0 = 0;
  if ((((handle == (igsc_device_handle *)0x0) || (handle->ctx == (igsc_lib_ctx *)0x0)) ||
      (result == (uint8_t *)0x0)) ||
     ((run_status == (uint8_t *)0x0 || (error_code == (uint32_t *)0x0)))) {
    p_Var4 = igsc_get_log_callback_func();
    if (p_Var4 == (igsc_log_func_t)0x0) {
      pcVar5 = gsc_time(__time_buf_1 + 0x78,0x80);
      syslog(3,"%s: IGSC: (%s:%s():%d) Bad parameters\n",pcVar5,
             "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
             "igsc_ifr_run_test",0xcb);
    }
    else {
      p_Var4 = igsc_get_log_callback_func();
      pcVar5 = gsc_time(__time_buf_2 + 0x78,0x80);
      (*p_Var4)(IGSC_LOG_LEVEL_ERROR,"%s: IGSC: (%s:%s():%d) Bad parameters\n",pcVar5,
                "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
                "igsc_ifr_run_test",0xcb);
    }
    handle_local._4_4_ = 3;
  }
  else {
    lib_ctx_00 = handle->ctx;
    uVar2 = igsc_get_log_level();
    if (uVar2 != 0) {
      p_Var4 = igsc_get_log_callback_func();
      if (p_Var4 == (igsc_log_func_t)0x0) {
        pcVar5 = gsc_time(__time_buf_3 + 0x78,0x80);
        syslog(7,"%s: IGSC: (%s:%s():%d) in run test, initializing driver\n",pcVar5,
               "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
               "igsc_ifr_run_test",0xd1);
      }
      else {
        p_Var4 = igsc_get_log_callback_func();
        pcVar5 = gsc_time(__time_buf_3 + 0x78,0x80);
        (*p_Var4)(IGSC_LOG_LEVEL_DEBUG,"%s: IGSC: (%s:%s():%d) in run test, initializing driver\n",
                  pcVar5,"/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
                  "igsc_ifr_run_test",0xd1);
      }
    }
    handle_local._4_4_ = gsc_driver_init(lib_ctx_00,&GUID_METEE_IFR);
    if (handle_local._4_4_ == 0) {
      __s = lib_ctx_00->working_buffer;
      resp_header = (ifr_msg_hdr *)lib_ctx_00->working_buffer;
      buf_size = lib_ctx_00->working_buffer_length;
      uVar2 = igsc_get_log_level();
      if (uVar2 != 0) {
        p_Var4 = igsc_get_log_callback_func();
        if (p_Var4 == (igsc_log_func_t)0x0) {
          pcVar5 = gsc_time(__time_buf_6 + 0x78,0x80);
          syslog(7,"%s: IGSC: (%s:%s():%d) validating buffer\n",pcVar5,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
                 "igsc_ifr_run_test",0xe1);
        }
        else {
          p_Var4 = igsc_get_log_callback_func();
          pcVar5 = gsc_time(__time_buf_6 + 0x78,0x80);
          (*p_Var4)(IGSC_LOG_LEVEL_DEBUG,"%s: IGSC: (%s:%s():%d) validating buffer\n",pcVar5,
                    "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
                    "igsc_ifr_run_test",0xe1);
        }
      }
      request_len._4_4_ = gsc_fwu_buffer_validate(lib_ctx_00,8,0xc);
      if (request_len._4_4_ == 0) {
        memset(__s,0,8);
        *__s = '\0';
        __s[1] = __s[1] & 0x80;
        __s[4] = test_type;
        __s[5] = tiles_mask;
        uVar2 = igsc_get_log_level();
        if (uVar2 != 0) {
          p_Var4 = igsc_get_log_callback_func();
          if (p_Var4 == (igsc_log_func_t)0x0) {
            pcVar5 = gsc_time(__time_buf_9 + 0x78,0x80);
            syslog(7,"%s: IGSC: (%s:%s():%d) sending command\n",pcVar5,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
                   "igsc_ifr_run_test",0xf0);
          }
          else {
            p_Var4 = igsc_get_log_callback_func();
            pcVar5 = gsc_time(__time_buf_9 + 0x78,0x80);
            (*p_Var4)(IGSC_LOG_LEVEL_DEBUG,"%s: IGSC: (%s:%s():%d) sending command\n",pcVar5,
                      "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
                      "igsc_ifr_run_test",0xf0);
          }
        }
        request_len._4_4_ = gsc_tee_command(lib_ctx_00,__s,8,resp_header,buf_size,&local_ca0);
        if (request_len._4_4_ == 0) {
          if (local_ca0 < 4) {
            p_Var4 = igsc_get_log_callback_func();
            if (p_Var4 == (igsc_log_func_t)0x0) {
              pcVar5 = gsc_time(__time_buf_12 + 0x78,0x80);
              syslog(3,"%s: IGSC: (%s:%s():%d) Error in HECI read - bad size %zu\n",pcVar5,
                     "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
                     "igsc_ifr_run_test",0xfb,local_ca0);
            }
            else {
              p_Var4 = igsc_get_log_callback_func();
              pcVar5 = gsc_time(__time_buf_13 + 0x78,0x80);
              (*p_Var4)(IGSC_LOG_LEVEL_ERROR,
                        "%s: IGSC: (%s:%s():%d) Error in HECI read - bad size %zu\n",pcVar5,
                        "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
                        "igsc_ifr_run_test",0xfb,local_ca0);
            }
            request_len._4_4_ = 6;
          }
          else {
            *result = resp_header->result;
            iVar3 = ifr_heci_validate_response_header(lib_ctx_00,resp_header,(uint)(__s[1] & 0x7f));
            if (iVar3 == 0) {
              if (resp_header->result == '\0') {
                if (local_ca0 < 0xc) {
                  p_Var4 = igsc_get_log_callback_func();
                  if (p_Var4 == (igsc_log_func_t)0x0) {
                    pcVar5 = gsc_time(__time_buf_17 + 0x78,0x80);
                    syslog(3,"%s: IGSC: (%s:%s():%d) Error in HECI read - bad size %zu\n",pcVar5,
                           "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c"
                           ,"igsc_ifr_run_test",0x114,local_ca0);
                  }
                  else {
                    p_Var4 = igsc_get_log_callback_func();
                    pcVar5 = gsc_time(__time_buf_18 + 0x78,0x80);
                    (*p_Var4)(IGSC_LOG_LEVEL_ERROR,
                              "%s: IGSC: (%s:%s():%d) Error in HECI read - bad size %zu\n",pcVar5,
                              "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c"
                              ,"igsc_ifr_run_test",0x114,local_ca0);
                  }
                  request_len._4_4_ = 6;
                }
                else if (resp_header[1].group_id == test_type) {
                  if (resp_header[1].field_0x1 == tiles_mask) {
                    if (resp_header[1].result == '\0') {
                      *run_status = resp_header[1].reserved;
                      *error_code = (uint32_t)resp_header[2];
                      uVar2 = igsc_get_log_level();
                      if (uVar2 != 0) {
                        p_Var4 = igsc_get_log_callback_func();
                        if (p_Var4 == (igsc_log_func_t)0x0) {
                          pcVar5 = gsc_time((char *)&received_len,0x80);
                          syslog(7,"%s: IGSC: (%s:%s():%d) run test success\n",pcVar5,
                                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c"
                                 ,"igsc_ifr_run_test",0x133);
                        }
                        else {
                          p_Var4 = igsc_get_log_callback_func();
                          pcVar5 = gsc_time((char *)&received_len,0x80);
                          (*p_Var4)(IGSC_LOG_LEVEL_DEBUG,"%s: IGSC: (%s:%s():%d) run test success\n"
                                    ,pcVar5,
                                    "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c"
                                    ,"igsc_ifr_run_test",0x133);
                        }
                      }
                      request_len._4_4_ = 0;
                    }
                    else {
                      p_Var4 = igsc_get_log_callback_func();
                      if (p_Var4 == (igsc_log_func_t)0x0) {
                        pcVar5 = gsc_time(__time_buf_23 + 0x78,0x80);
                        syslog(3,"%s: IGSC: (%s:%s():%d) IFR Status response is leaking data\n",
                               pcVar5,
                               "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c"
                               ,"igsc_ifr_run_test",0x12a);
                      }
                      else {
                        p_Var4 = igsc_get_log_callback_func();
                        pcVar5 = gsc_time(__time_buf_24 + 0x78,0x80);
                        (*p_Var4)(IGSC_LOG_LEVEL_ERROR,
                                  "%s: IGSC: (%s:%s():%d) IFR Status response is leaking data\n",
                                  pcVar5,
                                  "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c"
                                  ,"igsc_ifr_run_test",0x12a);
                      }
                      request_len._4_4_ = 6;
                    }
                  }
                  else {
                    p_Var4 = igsc_get_log_callback_func();
                    if (p_Var4 == (igsc_log_func_t)0x0) {
                      pcVar5 = gsc_time(__time_buf_21 + 0x78,0x80);
                      syslog(3,
                             "%s: IGSC: (%s:%s():%d) Error in IFR Run Test response - tiles do not match\n"
                             ,pcVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c"
                             ,"igsc_ifr_run_test",0x123);
                    }
                    else {
                      p_Var4 = igsc_get_log_callback_func();
                      pcVar5 = gsc_time(__time_buf_22 + 0x78,0x80);
                      (*p_Var4)(IGSC_LOG_LEVEL_ERROR,
                                "%s: IGSC: (%s:%s():%d) Error in IFR Run Test response - tiles do not match\n"
                                ,pcVar5,
                                "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c"
                                ,"igsc_ifr_run_test",0x123);
                    }
                    request_len._4_4_ = 6;
                  }
                }
                else {
                  p_Var4 = igsc_get_log_callback_func();
                  if (p_Var4 == (igsc_log_func_t)0x0) {
                    pcVar5 = gsc_time(__time_buf_19 + 0x78,0x80);
                    syslog(3,
                           "%s: IGSC: (%s:%s():%d) Error in IFR Run Test response - test type do not match %u %u\n"
                           ,pcVar5,
                           "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c"
                           ,"igsc_ifr_run_test",0x11c,CONCAT44(uVar6,(uint)resp_header[1].group_id),
                           (uint)test_type);
                  }
                  else {
                    p_Var4 = igsc_get_log_callback_func();
                    pcVar5 = gsc_time(__time_buf_20 + 0x78,0x80);
                    (*p_Var4)(IGSC_LOG_LEVEL_ERROR,
                              "%s: IGSC: (%s:%s():%d) Error in IFR Run Test response - test type do not match %u %u\n"
                              ,pcVar5,
                              "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c"
                              ,"igsc_ifr_run_test",0x11c,
                              CONCAT44(uVar6,(uint)resp_header[1].group_id),(uint)test_type);
                  }
                  request_len._4_4_ = 6;
                }
              }
              else {
                uVar2 = igsc_get_log_level();
                if (uVar2 != 0) {
                  p_Var4 = igsc_get_log_callback_func();
                  if (p_Var4 == (igsc_log_func_t)0x0) {
                    pcVar5 = gsc_time(__time_buf_16 + 0x78,0x80);
                    syslog(7,"%s: IGSC: (%s:%s():%d) Run test command failed with result 0x%x\n",
                           pcVar5,
                           "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c"
                           ,"igsc_ifr_run_test",0x10d,CONCAT44(uVar6,(uint)resp_header->result));
                  }
                  else {
                    p_Var4 = igsc_get_log_callback_func();
                    pcVar5 = gsc_time(__time_buf_16 + 0x78,0x80);
                    (*p_Var4)(IGSC_LOG_LEVEL_DEBUG,
                              "%s: IGSC: (%s:%s():%d) Run test command failed with result 0x%x\n",
                              pcVar5,
                              "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c"
                              ,"igsc_ifr_run_test",0x10d,CONCAT44(uVar6,(uint)resp_header->result));
                  }
                }
                request_len._4_4_ = 6;
              }
            }
            else {
              p_Var4 = igsc_get_log_callback_func();
              if (p_Var4 == (igsc_log_func_t)0x0) {
                pcVar5 = gsc_time(__time_buf_14 + 0x78,0x80);
                syslog(3,"%s: IGSC: (%s:%s():%d) Invalid HECI message response %d\n",pcVar5,
                       "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
                       "igsc_ifr_run_test",0x106,CONCAT44(uVar6,iVar3));
              }
              else {
                p_Var4 = igsc_get_log_callback_func();
                pcVar5 = gsc_time(__time_buf_15 + 0x78,0x80);
                (*p_Var4)(IGSC_LOG_LEVEL_ERROR,
                          "%s: IGSC: (%s:%s():%d) Invalid HECI message response %d\n",pcVar5,
                          "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c"
                          ,"igsc_ifr_run_test",0x106,CONCAT44(uVar6,iVar3));
              }
              request_len._4_4_ = 6;
            }
          }
        }
        else {
          p_Var4 = igsc_get_log_callback_func();
          if (p_Var4 == (igsc_log_func_t)0x0) {
            pcVar5 = gsc_time(__time_buf_10 + 0x78,0x80);
            syslog(3,"%s: IGSC: (%s:%s():%d) Invalid HECI message response %d\n",pcVar5,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
                   "igsc_ifr_run_test",0xf5,CONCAT44(uVar6,request_len._4_4_));
          }
          else {
            p_Var4 = igsc_get_log_callback_func();
            pcVar5 = gsc_time(__time_buf_11 + 0x78,0x80);
            (*p_Var4)(IGSC_LOG_LEVEL_ERROR,
                      "%s: IGSC: (%s:%s():%d) Invalid HECI message response %d\n",pcVar5,
                      "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
                      "igsc_ifr_run_test",0xf5,CONCAT44(uVar6,request_len._4_4_));
          }
        }
      }
      else {
        p_Var4 = igsc_get_log_callback_func();
        if (p_Var4 == (igsc_log_func_t)0x0) {
          pcVar5 = gsc_time(__time_buf_7 + 0x78,0x80);
          syslog(3,"%s: IGSC: (%s:%s():%d) Internal error - failed to validate buffer %d\n",pcVar5,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
                 "igsc_ifr_run_test",0xe6,CONCAT44(uVar6,request_len._4_4_));
        }
        else {
          p_Var4 = igsc_get_log_callback_func();
          pcVar5 = gsc_time(__time_buf_8 + 0x78,0x80);
          (*p_Var4)(IGSC_LOG_LEVEL_ERROR,
                    "%s: IGSC: (%s:%s():%d) Internal error - failed to validate buffer %d\n",pcVar5,
                    "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
                    "igsc_ifr_run_test",0xe6,CONCAT44(uVar6,request_len._4_4_));
        }
      }
      gsc_driver_deinit(lib_ctx_00);
      handle_local._4_4_ = request_len._4_4_;
    }
    else {
      p_Var4 = igsc_get_log_callback_func();
      if (p_Var4 == (igsc_log_func_t)0x0) {
        pcVar5 = gsc_time(__time_buf_4 + 0x78,0x80);
        syslog(3,"%s: IGSC: (%s:%s():%d) Cannot initialize driver, status %d\n",pcVar5,
               "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
               "igsc_ifr_run_test",0xd6,CONCAT44(uVar6,handle_local._4_4_));
      }
      else {
        p_Var4 = igsc_get_log_callback_func();
        pcVar5 = gsc_time(__time_buf_5 + 0x78,0x80);
        (*p_Var4)(IGSC_LOG_LEVEL_ERROR,
                  "%s: IGSC: (%s:%s():%d) Cannot initialize driver, status %d\n",pcVar5,
                  "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/ifr.c",
                  "igsc_ifr_run_test",0xd6,CONCAT44(uVar6,handle_local._4_4_));
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return handle_local._4_4_;
}

Assistant:

int igsc_ifr_run_test(IN struct igsc_device_handle *handle,
                      IN uint8_t   test_type,
                      IN uint8_t   tiles_mask,
                      OUT uint8_t  *result,
                      OUT uint8_t  *run_status,
                      OUT uint32_t *error_code)
{
    int status;
    size_t request_len;
    size_t response_len;
    size_t received_len = 0;
    size_t buf_len;
    struct igsc_lib_ctx     *lib_ctx;
    struct ifr_run_test_req *req;
    struct ifr_run_test_res *resp;

    if (!handle || !handle->ctx || !result || !run_status || !error_code)
    {
        gsc_error("Bad parameters\n");
        return IGSC_ERROR_INVALID_PARAMETER;
    }

    lib_ctx = handle->ctx;

    gsc_debug("in run test, initializing driver\n");

    status = gsc_driver_init(lib_ctx, &GUID_METEE_IFR);
    if (status != IGSC_SUCCESS)
    {
        gsc_error("Cannot initialize driver, status %d\n", status);
        return status;
    }

    req = (struct ifr_run_test_req *)lib_ctx->working_buffer;
    request_len = sizeof(*req);

    resp = (struct ifr_run_test_res *)lib_ctx->working_buffer;
    response_len = sizeof(*resp);
    buf_len = lib_ctx->working_buffer_length;

    gsc_debug("validating buffer\n");

    status = gsc_fwu_buffer_validate(lib_ctx, request_len, response_len);
    if (status != IGSC_SUCCESS)
    {
        gsc_error("Internal error - failed to validate buffer %d\n", status);
        goto exit;
    }

    memset(req, 0, request_len);
    req->header.group_id = GFX_DIAG_IFR_GROUP;
    req->header.command = IFR_RUN_TEST_CMD;
    req->test_type = test_type;
    req->tiles_map = tiles_mask;

    gsc_debug("sending command\n");

    status = gsc_tee_command(lib_ctx, req, request_len, resp, buf_len, &received_len);
    if (status != IGSC_SUCCESS)
    {
        gsc_error("Invalid HECI message response %d\n", status);
        goto exit;
    }

    if (received_len < sizeof(resp->header))
    {
        gsc_error("Error in HECI read - bad size %zu\n", received_len);
        status = IGSC_ERROR_PROTOCOL;
        goto exit;
    }

    *result = (uint8_t)resp->header.result;

    status = ifr_heci_validate_response_header(lib_ctx, &resp->header,
                                               req->header.command);
    if (status != IGSC_SUCCESS)
    {
        gsc_error("Invalid HECI message response %d\n", status);
        status = IGSC_ERROR_PROTOCOL;
        goto exit;
    }

    if (resp->header.result != 0)
    {
       gsc_debug("Run test command failed with result 0x%x\n", resp->header.result);
       status = IGSC_ERROR_PROTOCOL;
       goto exit;
    }

    if (received_len < response_len)
    {
        gsc_error("Error in HECI read - bad size %zu\n", received_len);
        status = IGSC_ERROR_PROTOCOL;
        goto exit;
    }

    if (resp->test_type != test_type)
    {
        gsc_error("Error in IFR Run Test response - test type do not match %u %u\n",
                  resp->test_type, test_type);
        status = IGSC_ERROR_PROTOCOL;
        goto exit;
    }

    if (resp->tiles_map != tiles_mask)
    {
        gsc_error("Error in IFR Run Test response - tiles do not match\n");
        status = IGSC_ERROR_PROTOCOL;
        goto exit;
    }

    if (resp->reserved !=0)
    {
        gsc_error("IFR Status response is leaking data\n");
        status = IGSC_ERROR_PROTOCOL;
        goto exit;
    }


    *run_status = resp->run_status;
    *error_code = resp->error_code;

    gsc_debug("run test success\n");

exit:
    gsc_driver_deinit(lib_ctx);
    return status;
}